

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O0

int ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int __fd;
  int *piVar1;
  ssize_t sVar2;
  undefined1 local_19;
  int fd;
  char c_local;
  char *name_local;
  
  local_19 = (undefined1)type;
  _fd = ctx;
  __fd = open_write("supervise/control");
  if (__fd == -1) {
    piVar1 = __errno_location();
    if (*piVar1 == error_nodevice) {
      warnx((char *)_fd,"runsv not running.");
    }
    else {
      warn((char *)_fd,"unable to open supervise/control");
    }
    name_local._4_4_ = -1;
  }
  else {
    sVar2 = write(__fd,&local_19,1);
    if (sVar2 == 1) {
      name_local._4_4_ = 1;
    }
    else {
      warn((char *)_fd,"unable to write to supervise/control");
      name_local._4_4_ = -1;
    }
  }
  return name_local._4_4_;
}

Assistant:

int ctrl(char *name, char c) {
  int fd;

  if ((fd =open_write("supervise/control")) == -1) {
    if (errno == error_nodevice)
      warnx(name, "runsv not running.");
    else
      warn(name, "unable to open supervise/control");
    return(-1);
  }
  if (write(fd, &c, 1) != 1) {
    warn(name, "unable to write to supervise/control");
    return(-1);
  }
  return(1);
}